

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BYTE * opj_jp2_write_ihdr(opj_jp2_t *jp2,OPJ_UINT32 *p_nb_bytes_written)

{
  OPJ_BYTE *p_buffer;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x27d,"OPJ_BYTE *opj_jp2_write_ihdr(opj_jp2_t *, OPJ_UINT32 *)");
  }
  if (p_nb_bytes_written != (OPJ_UINT32 *)0x0) {
    p_buffer = (OPJ_BYTE *)opj_calloc(1,0x16);
    if (p_buffer != (OPJ_BYTE *)0x0) {
      opj_write_bytes_LE(p_buffer,0x16,4);
      opj_write_bytes_LE(p_buffer + 4,0x69686472,4);
      opj_write_bytes_LE(p_buffer + 8,jp2->h,4);
      opj_write_bytes_LE(p_buffer + 0xc,jp2->w,4);
      opj_write_bytes_LE(p_buffer + 0x10,jp2->numcomps,2);
      opj_write_bytes_LE(p_buffer + 0x12,jp2->bpc,1);
      opj_write_bytes_LE(p_buffer + 0x13,jp2->C,1);
      opj_write_bytes_LE(p_buffer + 0x14,jp2->UnkC,1);
      opj_write_bytes_LE(p_buffer + 0x15,jp2->IPR,1);
      *p_nb_bytes_written = 0x16;
    }
    return p_buffer;
  }
  __assert_fail("p_nb_bytes_written != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x27e,"OPJ_BYTE *opj_jp2_write_ihdr(opj_jp2_t *, OPJ_UINT32 *)");
}

Assistant:

static OPJ_BYTE * opj_jp2_write_ihdr(opj_jp2_t *jp2,
                                     OPJ_UINT32 * p_nb_bytes_written
                                    )
{
    OPJ_BYTE * l_ihdr_data, * l_current_ihdr_ptr;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_nb_bytes_written != 00);

    /* default image header is 22 bytes wide */
    l_ihdr_data = (OPJ_BYTE *) opj_calloc(1, 22);
    if (l_ihdr_data == 00) {
        return 00;
    }

    l_current_ihdr_ptr = l_ihdr_data;

    opj_write_bytes(l_current_ihdr_ptr, 22, 4);             /* write box size */
    l_current_ihdr_ptr += 4;

    opj_write_bytes(l_current_ihdr_ptr, JP2_IHDR, 4);       /* IHDR */
    l_current_ihdr_ptr += 4;

    opj_write_bytes(l_current_ihdr_ptr, jp2->h, 4);     /* HEIGHT */
    l_current_ihdr_ptr += 4;

    opj_write_bytes(l_current_ihdr_ptr, jp2->w, 4);     /* WIDTH */
    l_current_ihdr_ptr += 4;

    opj_write_bytes(l_current_ihdr_ptr, jp2->numcomps, 2);      /* NC */
    l_current_ihdr_ptr += 2;

    opj_write_bytes(l_current_ihdr_ptr, jp2->bpc, 1);       /* BPC */
    ++l_current_ihdr_ptr;

    opj_write_bytes(l_current_ihdr_ptr, jp2->C, 1);     /* C : Always 7 */
    ++l_current_ihdr_ptr;

    opj_write_bytes(l_current_ihdr_ptr, jp2->UnkC,
                    1);      /* UnkC, colorspace unknown */
    ++l_current_ihdr_ptr;

    opj_write_bytes(l_current_ihdr_ptr, jp2->IPR,
                    1);       /* IPR, no intellectual property */
    ++l_current_ihdr_ptr;

    *p_nb_bytes_written = 22;

    return l_ihdr_data;
}